

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Float pbrt::SampleCatmullRom
                (span<const_float> x,span<const_float> f,span<const_float> F,Float u,Float *fval,
                Float *pdf)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  float *pfVar11;
  int iVar12;
  float *pfVar13;
  ulong uVar14;
  char *args;
  long lVar15;
  char *args_1;
  Float t;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  pair<float,_float> pVar19;
  undefined1 auVar20 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  Float f0;
  undefined4 uStack_c4;
  Float fhat;
  float local_bc;
  float local_b8;
  float local_b4;
  Float f1;
  float local_ac;
  undefined1 local_a8 [16];
  Float Fhat;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  size_t va;
  Float *local_58;
  float *local_50;
  float *local_48;
  Float *local_40;
  Float *local_38;
  float *local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  pfVar13 = F.ptr;
  uVar9 = x.n;
  pfVar11 = x.ptr;
  _f0 = f.n;
  pfVar8 = f.ptr;
  if (uVar9 == _f0) {
    if (uVar9 == F.n) {
      uVar7 = uVar9 - 2;
      lVar15 = 1;
      uVar10 = uVar7;
      while (uVar14 = uVar10, 0 < (long)uVar14) {
        uVar10 = uVar14 >> 1;
        if (pfVar13[(int)uVar10 + (int)lVar15] <= u * pfVar13[uVar9 - 1]) {
          lVar15 = uVar10 + 1 + lVar15;
          uVar10 = ~uVar10 + uVar14;
        }
      }
      if (lVar15 - 1U < uVar7) {
        uVar7 = lVar15 - 1U;
      }
      uVar10 = 0;
      if (0 < lVar15) {
        uVar10 = uVar7;
      }
      iVar12 = (int)uVar10;
      local_8c = pfVar8[iVar12];
      local_b8 = pfVar11[iVar12];
      lVar15 = (long)((uVar10 << 0x20) + 0x100000000) >> 0x1e;
      fVar18 = *(float *)((long)pfVar11 + lVar15);
      _f0 = CONCAT44(F.n._4_4_,local_8c);
      f1 = *(float *)((long)pfVar8 + lVar15);
      local_bc = fVar18 - local_b8;
      if (iVar12 < 1) {
        local_b4 = f1 - local_8c;
      }
      else {
        local_b4 = (local_bc * (f1 - pfVar8[iVar12 - 1U])) / (fVar18 - pfVar11[iVar12 - 1U]);
      }
      uVar7 = (long)((uVar10 << 0x20) + 0x200000000) >> 0x20;
      if (uVar7 < uVar9) {
        local_8c = (local_bc * (pfVar8[uVar7] - local_8c)) / (pfVar11[uVar7] - local_b8);
      }
      else {
        local_8c = f1 - local_8c;
      }
      local_48 = &local_8c;
      va = (size_t)&Fhat;
      local_58 = &f0;
      local_30 = &local_ac;
      local_50 = &local_b4;
      local_40 = &f1;
      local_38 = &fhat;
      local_ac = (u * pfVar13[uVar9 - 1] - pfVar13[iVar12]) / local_bc;
      pVar19 = SampleCatmullRom::anon_class_56_7_ed507bea::operator()
                         ((anon_class_56_7_ed507bea *)&va,0.0);
      local_a8._8_8_ = extraout_XMM0_Qb;
      local_a8._0_4_ = pVar19.first;
      local_a8._4_4_ = pVar19.second;
      auVar21._0_8_ =
           SampleCatmullRom::anon_class_56_7_ed507bea::operator()
                     ((anon_class_56_7_ed507bea *)&va,1.0);
      auVar21._8_56_ = extraout_var;
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl(local_a8,auVar24);
      auVar24 = ZEXT816(0) << 0x40;
      if (1e-06 <= auVar17._0_4_) {
        auVar17._8_4_ = 0x7fffffff;
        auVar17._0_8_ = 0x7fffffff7fffffff;
        auVar17._12_4_ = 0x7fffffff;
        auVar17 = vandps_avx512vl(auVar21._0_16_,auVar17);
        auVar24 = SUB6416(ZEXT464(0x3f800000),0);
        if (1e-06 <= auVar17._0_4_) {
          auVar23 = ZEXT464(0x3f800000);
          uVar1 = vcmpps_avx512vl(local_a8,ZEXT816(0) << 0x20,1);
          local_88 = ZEXT816(0) << 0x20;
          fVar18 = 0.0 - local_a8._0_4_ / (auVar21._0_4_ - local_a8._0_4_);
          while( true ) {
            fVar16 = (auVar23._0_4_ + local_88._0_4_) * 0.5;
            local_78 = auVar23._0_16_;
            uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar18),local_78,1);
            bVar3 = (bool)((byte)uVar2 & 1);
            uVar2 = vcmpss_avx512f(local_88,ZEXT416((uint)fVar18),1);
            bVar4 = (bool)((byte)uVar2 & 1);
            t = (Float)((uint)bVar4 * ((uint)bVar3 * (int)fVar18 + (uint)!bVar3 * (int)fVar16) +
                       (uint)!bVar4 * (int)fVar16);
            local_a8 = ZEXT416((uint)t);
            auVar22._0_8_ =
                 SampleCatmullRom::anon_class_56_7_ed507bea::operator()
                           ((anon_class_56_7_ed507bea *)&va,t);
            auVar22._8_56_ = extraout_var_00;
            auVar6._8_4_ = 0x7fffffff;
            auVar6._0_8_ = 0x7fffffff7fffffff;
            auVar6._12_4_ = 0x7fffffff;
            auVar20 = auVar22._0_16_;
            auVar17 = vandps_avx512vl(auVar20,auVar6);
            auVar24 = local_a8;
            if (auVar17._0_4_ < 1e-06) break;
            uVar2 = vcmpps_avx512vl(auVar20,ZEXT816(0),5);
            bVar5 = (byte)uVar1 ^ (byte)uVar2;
            fVar18 = local_a8._0_4_;
            fVar16 = (float)((uint)(bVar5 & 1) * local_78._0_4_ +
                            (uint)!(bool)(bVar5 & 1) * (int)fVar18);
            local_88._0_4_ =
                 (float)((uint)(bVar5 & 1) * (int)fVar18 + (uint)!(bool)(bVar5 & 1) * local_88._0_4_
                        );
            if (fVar16 - local_88._0_4_ < 1e-06) break;
            auVar24 = vmovshdup_avx(auVar20);
            auVar23 = ZEXT1664(CONCAT124(local_a8._4_12_,fVar16));
            fVar18 = fVar18 - auVar22._0_4_ / auVar24._0_4_;
          }
        }
      }
      if (fval != (Float *)0x0) {
        *fval = fhat;
      }
      if (pdf != (Float *)0x0) {
        *pdf = fhat / pfVar13[uVar9 - 1];
      }
      auVar24 = vfmadd213ss_fma(auVar24,ZEXT416((uint)local_bc),ZEXT416((uint)local_b8));
      return auVar24._0_4_;
    }
    args_1 = "F.size()";
    args = "f.size()";
    iVar12 = 0x18d;
    _f0 = F.n;
  }
  else {
    args_1 = "f.size()";
    args = "x.size()";
    iVar12 = 0x18c;
  }
  local_ac = u;
  va = uVar9;
  LogFatal<char_const(&)[9],char_const(&)[9],char_const(&)[9],unsigned_long&,char_const(&)[9],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
             ,iVar12,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])args,
             (char (*) [9])args_1,(char (*) [9])args,&va,(char (*) [9])args_1,(unsigned_long *)&f0);
}

Assistant:

Float SampleCatmullRom(pstd::span<const Float> x, pstd::span<const Float> f,
                       pstd::span<const Float> F, Float u, Float *fval, Float *pdf) {
    CHECK_EQ(x.size(), f.size());
    CHECK_EQ(f.size(), F.size());
    // Map _u_ to a spline interval by inverting _F_
    u *= F.back();
    int i = FindInterval(F.size(), [&](int i) { return F[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = x[i], x1 = x[i + 1];
    Float f0 = f[i], f1 = f[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0, d1;
    if (i > 0)
        d0 = width * (f1 - f[i - 1]) / (x1 - x[i - 1]);
    else
        d0 = f1 - f0;
    if (i + 2 < x.size())
        d1 = width * (f[i + 2] - f0) / (x[i + 2] - x0);
    else
        d1 = f1 - f0;

    // Re-scale _u_ for continous spline sampling step
    u = (u - F[i]) / width;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat =
            EvaluatePolynomial(t, 0, f0, .5f * d0, (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                               .25f * (d0 + d1) + .5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / F.back();
    return x0 + width * t;
}